

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O2

void * amqp_simple_rpc_decoded
                 (amqp_connection_state_t state,amqp_channel_t channel,
                 amqp_method_number_t request_id,amqp_method_number_t reply_id,
                 void *decoded_request_method)

{
  int iVar1;
  amqp_time_t deadline;
  amqp_method_number_t replies [2];
  amqp_time_t local_58;
  amqp_method_number_t local_50 [2];
  amqp_rpc_reply_t local_48;
  
  iVar1 = amqp_time_from_now(&local_58,state->rpc_timeout);
  if (iVar1 == 0) {
    local_50[1] = 0;
    local_50[0] = reply_id;
    simple_rpc_inner(&local_48,state,channel,request_id,local_50,decoded_request_method,local_58);
    (state->most_recent_api_result).reply.decoded = local_48.reply.decoded;
    (state->most_recent_api_result).library_error = local_48.library_error;
    *(undefined4 *)&(state->most_recent_api_result).field_0x1c = local_48._28_4_;
    (state->most_recent_api_result).reply_type = local_48.reply_type;
    *(undefined4 *)&(state->most_recent_api_result).field_0x4 = local_48._4_4_;
    (state->most_recent_api_result).reply.id = local_48.reply.id;
    *(undefined4 *)&(state->most_recent_api_result).reply.field_0x4 = local_48.reply._4_4_;
    if ((state->most_recent_api_result).reply_type == AMQP_RESPONSE_NORMAL) {
      return (state->most_recent_api_result).reply.decoded;
    }
  }
  else {
    (state->most_recent_api_result).reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    (state->most_recent_api_result).library_error = iVar1;
  }
  return (void *)0x0;
}

Assistant:

void *amqp_simple_rpc_decoded(amqp_connection_state_t state,
                              amqp_channel_t channel,
                              amqp_method_number_t request_id,
                              amqp_method_number_t reply_id,
                              void *decoded_request_method) {
  amqp_time_t deadline;
  int res;
  amqp_method_number_t replies[2];

  res = amqp_time_from_now(&deadline, state->rpc_timeout);
  if (res != AMQP_STATUS_OK) {
    state->most_recent_api_result = amqp_rpc_reply_error(res);
    return NULL;
  }

  replies[0] = reply_id;
  replies[1] = 0;

  state->most_recent_api_result = simple_rpc_inner(
      state, channel, request_id, replies, decoded_request_method, deadline);

  if (state->most_recent_api_result.reply_type == AMQP_RESPONSE_NORMAL) {
    return state->most_recent_api_result.reply.decoded;
  } else {
    return NULL;
  }
}